

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O0

void node::fav_child_processing_order<node::TreeIndexJSON>
               (TreeIndexJSON *ti,int *postorder,int *favorder)

{
  int iVar1;
  value_type vVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  uint local_24;
  uint t;
  int *favorder_local;
  int *postorder_local;
  TreeIndexJSON *ti_local;
  
  pvVar3 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&(ti->super_PostLToChildren).postl_to_children_,(long)*postorder);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
  if (sVar4 != 0) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(ti->super_PostLToFavChild).postl_to_fav_child_,(long)*postorder);
    fav_child_processing_order<node::TreeIndexJSON>(ti,pvVar5,favorder);
    local_24 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(ti->super_PostLToChildren).postl_to_children_,(long)*postorder);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (sVar4 <= local_24) break;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(ti->super_PostLToChildren).postl_to_children_,(long)*postorder);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_24);
      iVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(ti->super_PostLToFavChild).postl_to_fav_child_,(long)*postorder);
      if (iVar1 != *pvVar5) {
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(ti->super_PostLToChildren).postl_to_children_,(long)*postorder);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_24);
        fav_child_processing_order<node::TreeIndexJSON>(ti,pvVar5,favorder);
      }
      local_24 = local_24 + 1;
    }
  }
  vVar2 = *postorder;
  iVar1 = *favorder;
  *favorder = iVar1 + 1;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(ti->super_PostLToFavorableChildOrder).postl_to_favorder_,(long)iVar1);
  *pvVar5 = vVar2;
  return;
}

Assistant:

void fav_child_processing_order(TreeIndex& ti, int& postorder, int& favorder) {
  // Perform recursively for children.
  if (ti.postl_to_children_[postorder].size() != 0) {
    // First process the favorable child.
    fav_child_processing_order(ti, ti.postl_to_fav_child_[postorder], favorder);
    // Next, process all other children.
    for (unsigned int t = 0; t < ti.postl_to_children_[postorder].size(); ++t) {
      // Favorable child was processed before.
      if (ti.postl_to_children_[postorder][t] == ti.postl_to_fav_child_[postorder]) {
        continue;
      }
      // Process other children in left to right order.
      fav_child_processing_order(ti, ti.postl_to_children_[postorder][t], favorder);
    }
  }
  // Assign favorder to postorder.
  ti.postl_to_favorder_[favorder++] = postorder;
}